

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_base.cpp
# Opt level: O3

void duckdb::ToBaseFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  anon_union_16_2_67f50693_for_value *paVar2;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  reference this_00;
  reference this_01;
  reference this_02;
  idx_t iVar6;
  ulong uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  idx_t iVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  ValidityMask *in_R8;
  idx_t in_R9;
  idx_t idx_in_entry;
  idx_t iVar14;
  ulong uVar15;
  data_ptr_t pdVar16;
  string_t sVar17;
  anon_struct_16_3_d7536bce_for_pointer aVar18;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  buffer_ptr<ValidityBuffer> *local_118;
  idx_t local_110;
  UnifiedVectorFormat local_108;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  this_00 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  this_01 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  this_02 = vector<duckdb::Vector,_true>::operator[](&args->data,2);
  count = args->count;
  if (((this_00->vector_type == CONSTANT_VECTOR) && (this_01->vector_type == CONSTANT_VECTOR)) &&
     (this_02->vector_type == CONSTANT_VECTOR)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar1 = (this_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) ||
        ((puVar1 = (this_01->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
         puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) ||
       ((puVar1 = (this_02->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) {
      ConstantVector::SetNull(result,true);
      return;
    }
    paVar2 = (anon_union_16_2_67f50693_for_value *)result->data;
    aVar18 = (anon_struct_16_3_d7536bce_for_pointer)
             TernaryLambdaWrapper::
             Operation<duckdb::ToBaseFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,long,int,int,duckdb::string_t>
                       ((anon_class_8_1_6971b95b)result,*(long *)this_00->data,*(int *)this_01->data
                        ,*(int *)this_02->data,in_R8,in_R9);
    paVar2->pointer = aVar18;
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
    Vector::ToUnifiedFormat(this_00,count,&local_78);
    Vector::ToUnifiedFormat(this_01,count,&local_c0);
    Vector::ToUnifiedFormat(this_02,count,&local_108);
    pdVar16 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) &&
        (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0)) &&
       (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0)) {
      if (count != 0) {
        pdVar16 = pdVar16 + 8;
        iVar14 = 0;
        do {
          iVar6 = iVar14;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar6 = (idx_t)(local_78.sel)->sel_vector[iVar14];
          }
          iVar10 = iVar14;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            iVar10 = (idx_t)(local_c0.sel)->sel_vector[iVar14];
          }
          iVar12 = iVar14;
          if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)(local_108.sel)->sel_vector[iVar14];
          }
          sVar17 = TernaryLambdaWrapper::
                   Operation<duckdb::ToBaseFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,long,int,int,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,*(long *)(local_78.data + iVar6 * 8),
                              *(int *)(local_c0.data + iVar10 * 4),
                              *(int *)(local_108.data + iVar12 * 4),in_R8,in_R9);
          *(long *)(pdVar16 + -8) = sVar17.value._0_8_;
          *(long *)pdVar16 = sVar17.value._8_8_;
          iVar14 = iVar14 + 1;
          pdVar16 = pdVar16 + 0x10;
        } while (count != iVar14);
      }
    }
    else if (count != 0) {
      local_118 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      pdVar16 = pdVar16 + 8;
      uVar15 = 0;
      do {
        uVar7 = uVar15;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_78.sel)->sel_vector[uVar15];
        }
        uVar11 = uVar15;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          uVar11 = (ulong)(local_c0.sel)->sel_vector[uVar15];
        }
        uVar13 = uVar15;
        if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
          uVar13 = (ulong)(local_108.sel)->sel_vector[uVar15];
        }
        if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6]
              >> (uVar7 & 0x3f) & 1) != 0)) &&
           (((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)) &&
            ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)))))) {
          sVar17 = TernaryLambdaWrapper::
                   Operation<duckdb::ToBaseFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,long,int,int,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,*(long *)(local_78.data + uVar7 * 8),
                              *(int *)(local_c0.data + uVar11 * 4),
                              *(int *)(local_108.data + uVar13 * 4),in_R8,in_R9);
          *(long *)(pdVar16 + -8) = sVar17.value._0_8_;
          *(long *)pdVar16 = sVar17.value._8_8_;
        }
        else {
          _Var9._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var9._M_head_impl == (unsigned_long *)0x0) {
            local_110 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_128,&local_110);
            p_Var5 = p_Stack_120;
            peVar4 = local_128;
            local_128 = (element_type *)0x0;
            p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar4;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var5;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (local_118);
            _Var9._M_head_impl =
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var9._M_head_impl;
          }
          bVar3 = (byte)uVar15 & 0x3f;
          _Var9._M_head_impl[uVar15 >> 6] =
               _Var9._M_head_impl[uVar15 >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        uVar15 = uVar15 + 1;
        pdVar16 = pdVar16 + 0x10;
      } while (count != uVar15);
    }
    if (local_108.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_c0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void ToBaseFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input = args.data[0];
	auto &radix = args.data[1];
	auto &min_length = args.data[2];
	auto count = args.size();

	TernaryExecutor::Execute<int64_t, int32_t, int32_t, string_t>(
	    input, radix, min_length, result, count, [&](int64_t input, int32_t radix, int32_t min_length) {
		    if (input < 0) {
			    throw InvalidInputException("'to_base' number must be greater than or equal to 0");
		    }
		    if (radix < 2 || radix > 36) {
			    throw InvalidInputException("'to_base' radix must be between 2 and 36");
		    }
		    if (min_length > 64 || min_length < 0) {
			    throw InvalidInputException("'to_base' min_length must be between 0 and 64");
		    }

		    char buf[64];
		    char *end = buf + sizeof(buf);
		    char *ptr = end;
		    do {
			    *--ptr = alphabet[input % radix];
			    input /= radix;
		    } while (input > 0);

		    auto length = end - ptr;
		    while (length < min_length) {
			    *--ptr = '0';
			    length++;
		    }

		    return StringVector::AddString(result, ptr, UnsafeNumericCast<idx_t>(end - ptr));
	    });
}